

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2)

{
  LogMessage *pLVar1;
  DescriptorStringView psVar2;
  undefined1 local_c0 [8];
  StreamReporter reporter;
  StringOutputStream output_stream;
  undefined1 local_78 [7];
  bool result;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  parent_fields;
  LogMessageDebugFatal local_50 [23];
  Voidify local_39;
  Descriptor *local_38;
  Descriptor *descriptor2;
  Descriptor *descriptor1;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  descriptor1 = (Descriptor *)message2;
  message2_local = message1;
  message1_local = (Message *)this;
  descriptor2 = Message::GetDescriptor(message1);
  local_38 = Message::GetDescriptor((Message *)descriptor1);
  if (descriptor2 == local_38) {
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
              *)local_78);
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear(&(this->force_compare_no_presence_fields_).
             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           );
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(this->force_compare_failure_triggering_fields_).
             super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    if (this->output_string_ == (string *)0x0) {
      output_stream.target_._7_1_ =
           Compare(this,message2_local,(Message *)descriptor1,0,
                   (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    *)local_78);
    }
    else {
      io::StringOutputStream::StringOutputStream
                ((StringOutputStream *)&reporter.unpack_any_field_,this->output_string_);
      StreamReporter::StreamReporter
                ((StreamReporter *)local_c0,(ZeroCopyOutputStream *)&reporter.unpack_any_field_);
      StreamReporter::SetMessages((StreamReporter *)local_c0,message2_local,(Message *)descriptor1);
      this->reporter_ = (Reporter *)local_c0;
      output_stream.target_._7_1_ =
           Compare(this,message2_local,(Message *)descriptor1,0,
                   (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    *)local_78);
      this->reporter_ = (Reporter *)0x0;
      StreamReporter::~StreamReporter((StreamReporter *)local_c0);
      io::StringOutputStream::~StringOutputStream((StringOutputStream *)&reporter.unpack_any_field_)
      ;
    }
    this_local._7_1_ = output_stream.target_._7_1_;
    std::
    vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
    ::~vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               *)local_78);
  }
  else {
    absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
               ,0x217);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [48])"Comparison between two messages with different ");
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [14])"descriptors. ");
    psVar2 = Descriptor::full_name_abi_cxx11_(descriptor2);
    pLVar1 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(string *)psVar2);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(char (*) [5])" vs ");
    psVar2 = Descriptor::full_name_abi_cxx11_(local_38);
    pLVar1 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(string *)psVar2);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal(local_50);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2) {
  const Descriptor* descriptor1 = message1.GetDescriptor();
  const Descriptor* descriptor2 = message2.GetDescriptor();
  if (descriptor1 != descriptor2) {
    ABSL_DLOG(FATAL) << "Comparison between two messages with different "
                     << "descriptors. " << descriptor1->full_name() << " vs "
                     << descriptor2->full_name();
    return false;
  }

  std::vector<SpecificField> parent_fields;
  force_compare_no_presence_fields_.clear();
  force_compare_failure_triggering_fields_.clear();

  bool result = false;
  // Setup the internal reporter if need be.
  if (output_string_) {
    io::StringOutputStream output_stream(output_string_);
    StreamReporter reporter(&output_stream);
    reporter.SetMessages(message1, message2);
    reporter_ = &reporter;
    result = Compare(message1, message2, false, &parent_fields);
    reporter_ = NULL;
  } else {
    result = Compare(message1, message2, false, &parent_fields);
  }
  return result;
}